

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16a02::InstrumentMemoryAccesses::visitMemIntrinsic
          (InstrumentMemoryAccesses *this,MemIntrinsic *MI)

{
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *this_00;
  Type *DestTy;
  Value *pVVar1;
  MemTransferBase<llvm::MemIntrinsic> *this_01;
  MemTransferInst *MTI;
  Value *local_20;
  Value *AccessSize;
  MemIntrinsic *MI_local;
  InstrumentMemoryAccesses *this_local;
  
  AccessSize = (Value *)MI;
  MI_local = (MemIntrinsic *)this;
  llvm::IRBuilderBase::SetInsertPoint(&this->Builder->super_IRBuilderBase,(Instruction *)MI);
  this_00 = this->Builder;
  pVVar1 = llvm::MemIntrinsicBase<llvm::MemIntrinsic>::getLength
                     ((MemIntrinsicBase<llvm::MemIntrinsic> *)AccessSize);
  DestTy = (Type *)this->SizeTy;
  llvm::Twine::Twine((Twine *)&MTI,"");
  local_20 = llvm::IRBuilderBase::CreateIntCast
                       (&this_00->super_IRBuilderBase,pVVar1,DestTy,false,(Twine *)&MTI);
  this_01 = &llvm::dyn_cast<llvm::MemTransferInst,llvm::MemIntrinsic>((MemIntrinsic *)AccessSize)->
             super_MemTransferBase<llvm::MemIntrinsic>;
  if (this_01 != (MemTransferBase<llvm::MemIntrinsic> *)0x0) {
    pVVar1 = llvm::MemTransferBase<llvm::MemIntrinsic>::getSource(this_01);
    instrument(this,pVVar1,local_20,this->LoadCheckFunction,(Instruction *)AccessSize);
  }
  pVVar1 = llvm::MemIntrinsicBase<llvm::MemIntrinsic>::getDest
                     ((MemIntrinsicBase<llvm::MemIntrinsic> *)AccessSize);
  instrument(this,pVVar1,local_20,this->StoreCheckFunction,(Instruction *)AccessSize);
  llvm::TrackingStatistic::operator++(&IntrinsicsInstrumented);
  return;
}

Assistant:

void InstrumentMemoryAccesses::visitMemIntrinsic(MemIntrinsic &MI) {
    // Instrument llvm.mem[set|cpy|move].* calls with load/store checks.
    Builder->SetInsertPoint(&MI);
    Value *AccessSize = Builder->CreateIntCast(MI.getLength(), SizeTy,
            /*isSigned=*/false);

    // memcpy and memmove have a source memory area but memset doesn't
    if (MemTransferInst *MTI = dyn_cast<MemTransferInst>(&MI))
        instrument(MTI->getSource(), AccessSize, LoadCheckFunction, MI);
    instrument(MI.getDest(), AccessSize, StoreCheckFunction, MI);
    ++IntrinsicsInstrumented;
}